

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

int __thiscall MeCab::Writer::open(Writer *this,char *__file,int __oflag,...)

{
  bool bVar1;
  code *pcVar2;
  ostream *poVar3;
  int iVar4;
  string ostyle;
  string node_format2;
  string node_format_key;
  string eos_format;
  string bos_format;
  string unk_format;
  string bos_format2;
  string eon_format_key;
  string unk_format_key;
  string eos_format_key;
  string bos_format_key;
  string eon_format;
  string node_format;
  string eos_format2;
  string eon_format2;
  string unk_format2;
  
  Param::get<std::__cxx11::string>(&ostyle,(Param *)__file,"output-format-type");
  this->write_ = (offset_in_Writer_to_subr)writeLattice;
  *(undefined8 *)&this->field_0x1f8 = 0;
  bVar1 = std::operator==(&ostyle,"wakati");
  if (bVar1) {
    pcVar2 = writeWakati;
LAB_0015b7c0:
    this->write_ = (offset_in_Writer_to_subr)pcVar2;
    *(undefined8 *)&this->field_0x1f8 = 0;
  }
  else {
    bVar1 = std::operator==(&ostyle,"none");
    if (bVar1) {
      pcVar2 = writeNone;
      goto LAB_0015b7c0;
    }
    bVar1 = std::operator==(&ostyle,"dump");
    if (bVar1) {
      pcVar2 = writeDump;
      goto LAB_0015b7c0;
    }
    bVar1 = std::operator==(&ostyle,"em");
    if (bVar1) {
      pcVar2 = writeEM;
      goto LAB_0015b7c0;
    }
    std::__cxx11::string::string((string *)&node_format,"%m\\t%H\\n",(allocator *)&unk_format);
    std::__cxx11::string::string((string *)&unk_format,"%m\\t%H\\n",(allocator *)&bos_format);
    std::__cxx11::string::string((string *)&bos_format,"",(allocator *)&eos_format);
    std::__cxx11::string::string((string *)&eos_format,"EOS\\n",(allocator *)&eon_format);
    std::__cxx11::string::string((string *)&eon_format,"",(allocator *)&node_format_key);
    std::__cxx11::string::string
              ((string *)&node_format_key,"node-format",(allocator *)&bos_format_key);
    std::__cxx11::string::string
              ((string *)&bos_format_key,"bos-format",(allocator *)&eos_format_key);
    std::__cxx11::string::string
              ((string *)&eos_format_key,"eos-format",(allocator *)&unk_format_key);
    std::__cxx11::string::string
              ((string *)&unk_format_key,"unk-format",(allocator *)&eon_format_key);
    std::__cxx11::string::string((string *)&eon_format_key,"eon-format",(allocator *)&node_format2);
    if (ostyle._M_string_length == 0) {
LAB_0015b9e1:
      Param::get<std::__cxx11::string>
                (&node_format2,(Param *)__file,node_format_key._M_dataplus._M_p);
      Param::get<std::__cxx11::string>(&bos_format2,(Param *)__file,bos_format_key._M_dataplus._M_p)
      ;
      Param::get<std::__cxx11::string>(&eos_format2,(Param *)__file,eos_format_key._M_dataplus._M_p)
      ;
      Param::get<std::__cxx11::string>(&unk_format2,(Param *)__file,unk_format_key._M_dataplus._M_p)
      ;
      Param::get<std::__cxx11::string>(&eon_format2,(Param *)__file,eon_format_key._M_dataplus._M_p)
      ;
      bVar1 = std::operator!=(&node_format,&node_format2);
      if ((((bVar1) || (bVar1 = std::operator!=(&bos_format,&bos_format2), bVar1)) ||
          (bVar1 = std::operator!=(&eos_format,&eos_format2), bVar1)) ||
         (bVar1 = std::operator!=(&unk_format,&unk_format2), bVar1)) {
        this->write_ = (offset_in_Writer_to_subr)writeUser;
        *(undefined8 *)&this->field_0x1f8 = 0;
        bVar1 = std::operator!=(&node_format,&node_format2);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&node_format);
        }
        bVar1 = std::operator!=(&bos_format,&bos_format2);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&bos_format);
        }
        bVar1 = std::operator!=(&eos_format,&eos_format2);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&eos_format);
        }
        bVar1 = std::operator!=(&unk_format,&unk_format2);
        if (!bVar1) {
          std::operator!=(&node_format,&node_format2);
        }
        std::__cxx11::string::_M_assign((string *)&unk_format);
        bVar1 = std::operator!=(&eon_format,&eon_format2);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&eon_format);
        }
        scoped_string::reset_string(&this->node_format_,node_format._M_dataplus._M_p);
        scoped_string::reset_string(&this->bos_format_,bos_format._M_dataplus._M_p);
        scoped_string::reset_string(&this->eos_format_,eos_format._M_dataplus._M_p);
        scoped_string::reset_string(&this->unk_format_,unk_format._M_dataplus._M_p);
        this = (Writer *)&this->eon_format_;
        scoped_string::reset_string((scoped_string *)this,eon_format._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&eon_format2);
      std::__cxx11::string::~string((string *)&unk_format2);
      std::__cxx11::string::~string((string *)&eos_format2);
      std::__cxx11::string::~string((string *)&bos_format2);
      std::__cxx11::string::~string((string *)&node_format2);
      this = (Writer *)CONCAT71((int7)((ulong)this >> 8),1);
    }
    else {
      std::__cxx11::string::append((char *)&node_format_key);
      std::__cxx11::string::append((string *)&node_format_key);
      std::__cxx11::string::append((char *)&bos_format_key);
      std::__cxx11::string::append((string *)&bos_format_key);
      std::__cxx11::string::append((char *)&eos_format_key);
      std::__cxx11::string::append((string *)&eos_format_key);
      std::__cxx11::string::append((char *)&unk_format_key);
      std::__cxx11::string::append((string *)&unk_format_key);
      std::__cxx11::string::append((char *)&eon_format_key);
      std::__cxx11::string::append((string *)&eon_format_key);
      Param::get<std::__cxx11::string>
                (&node_format2,(Param *)__file,node_format_key._M_dataplus._M_p);
      if (node_format2._M_string_length != 0) {
        std::__cxx11::string::~string((string *)&node_format2);
        goto LAB_0015b9e1;
      }
      wlog::wlog((wlog *)&bos_format2,&this->what_);
      poVar3 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/writer.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"!tmp.empty()");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"unkown format type [");
      poVar3 = std::operator<<(poVar3,(string *)&ostyle);
      std::operator<<(poVar3,"]");
      std::__cxx11::string::~string((string *)&node_format2);
      this = (Writer *)0x0;
    }
    std::__cxx11::string::~string((string *)&eon_format_key);
    std::__cxx11::string::~string((string *)&unk_format_key);
    std::__cxx11::string::~string((string *)&eos_format_key);
    std::__cxx11::string::~string((string *)&bos_format_key);
    std::__cxx11::string::~string((string *)&node_format_key);
    std::__cxx11::string::~string((string *)&eon_format);
    std::__cxx11::string::~string((string *)&eos_format);
    std::__cxx11::string::~string((string *)&bos_format);
    std::__cxx11::string::~string((string *)&unk_format);
    std::__cxx11::string::~string((string *)&node_format);
    if ((char)this == '\0') {
      iVar4 = 0;
      goto LAB_0015b7d1;
    }
  }
  iVar4 = (int)CONCAT71((int7)((ulong)this >> 8),1);
LAB_0015b7d1:
  std::__cxx11::string::~string((string *)&ostyle);
  return iVar4;
}

Assistant:

bool Writer::open(const Param &param) {
  const std::string ostyle = param.get<std::string>("output-format-type");
  write_ = &Writer::writeLattice;

  if (ostyle == "wakati") {
    write_ = &Writer::writeWakati;
  } else if (ostyle == "none") {
    write_ = &Writer::writeNone;
  } else if (ostyle == "dump") {
    write_ = &Writer::writeDump;
  } else if (ostyle == "em") {
    write_ = &Writer::writeEM;
  } else {
    // default values
    std::string node_format = "%m\\t%H\\n";
    std::string unk_format  = "%m\\t%H\\n";
    std::string bos_format  = "";
    std::string eos_format  = "EOS\\n";
    std::string eon_format  = "";

    std::string node_format_key = "node-format";
    std::string bos_format_key  = "bos-format";
    std::string eos_format_key  = "eos-format";
    std::string unk_format_key  = "unk-format";
    std::string eon_format_key  = "eon-format";

    if (!ostyle.empty()) {
      node_format_key += "-";
      node_format_key += ostyle;
      bos_format_key += "-";
      bos_format_key += ostyle;
      eos_format_key += "-";
      eos_format_key += ostyle;
      unk_format_key += "-";
      unk_format_key += ostyle;
      eon_format_key += "-";
      eon_format_key += ostyle;
      const std::string tmp = param.get<std::string>(node_format_key.c_str());
      CHECK_FALSE(!tmp.empty()) << "unkown format type [" << ostyle << "]";
    }

    const std::string node_format2 =
        param.get<std::string>(node_format_key.c_str());
    const std::string bos_format2 =
        param.get<std::string>(bos_format_key.c_str());
    const std::string eos_format2 =
        param.get<std::string>(eos_format_key.c_str());
    const std::string unk_format2 =
        param.get<std::string>(unk_format_key.c_str());
    const std::string eon_format2 =
        param.get<std::string>(eon_format_key.c_str());

    if (node_format != node_format2 || bos_format != bos_format2 ||
        eos_format != eos_format2 || unk_format != unk_format2) {
      write_ = &Writer::writeUser;
      if (node_format != node_format2) {
        node_format = node_format2;
      }
      if (bos_format != bos_format2) {
        bos_format = bos_format2;
      }
      if (eos_format != eos_format2) {
        eos_format = eos_format2;
      }
      if (unk_format != unk_format2) {
        unk_format = unk_format2;
      } else if (node_format != node_format2) {
        unk_format = node_format2;
      } else {
        unk_format = node_format;
      }
      if (eon_format != eon_format2) {
        eon_format = eon_format2;
      }
      node_format_.reset_string(node_format.c_str());
      bos_format_.reset_string(bos_format.c_str());
      eos_format_.reset_string(eos_format.c_str());
      unk_format_.reset_string(unk_format.c_str());
      eon_format_.reset_string(eon_format.c_str());
    }
  }

  return true;
}